

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_ExtractAndInsertNodeHandleSet_Test::TestBody
          (Btree_ExtractAndInsertNodeHandleSet_Test *this)

{
  undefined1 auVar1 [8];
  _Alloc_hider _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar3;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  iterator iVar4;
  iterator position;
  iterator position_00;
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_> src2;
  node_type nh;
  insert_return_type res;
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_> other;
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_> src1;
  AssertHelper local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [4];
  aligned_storage_t<sizeof(slot_type),_alignof(slot_type)> aStack_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  AssertHelper local_78;
  node_type local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_60;
  undefined1 local_58 [5];
  bool local_53;
  aligned_storage_t<sizeof(slot_type),_alignof(slot_type)> local_50 [4];
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_> local_40;
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_> local_28;
  
  local_68 = (undefined1  [8])&DAT_200000001;
  pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_400000003;
  local_58._0_4_ = 5;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>>
  ::btree_set_container<int_const*>
            ((btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>>
              *)&local_28,(int *)local_68,(int *)(local_58 + 4),(key_compare *)local_b8,
             (allocator_type *)&local_40);
  local_68._0_4_ = 3;
  iVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          find<int>(&local_28,(int *)local_68);
  position._8_8_ = iVar4._8_8_ & 0xffffffff;
  position.node = iVar4.node;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::extract(&local_70,
            (btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
             *)&local_28,position);
  _local_b8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000005
  ;
  pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000002;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
  ::operator()(local_68,local_b8,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"src1");
  if (local_68[0] == '\0') {
    testing::Message::Message((Message *)local_b8);
    if (pbStack_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x720,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)_local_b8 + 8))();
    }
  }
  if (pbStack_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_60,pbStack_60);
  }
  local_40.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
        )&btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
          EmptyNode()::empty_node;
  local_40.rightmost_ =
       (node_type *)
       &btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
        EmptyNode()::empty_node;
  local_40.size_ = 0;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::insert((insert_return_type *)local_68,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
            *)&local_40,&local_70);
  local_90._0_4_ = 3;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_b8,local_90,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"other");
  if (local_b8[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_90);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x723,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_c8._0_4_ = 3;
  iVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          find<int>(&local_40,(int *)local_c8);
  local_90 = (undefined1  [8])iVar4.node;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_88._4_4_,iVar4.position);
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>>
            ((internal *)local_b8,"res.position","other.find(3)",
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)local_68,
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)local_90);
  if (local_b8[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_90);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x724,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_90[0] = local_58[0];
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_90,(AssertionResult *)"res.inserted","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x725,(char *)_local_b8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b8 != &local_a8) {
      operator_delete(_local_b8,
                      CONCAT26(local_a8._M_allocated_capacity._6_2_,
                               CONCAT15(local_a8._M_local_buf[5],
                                        CONCAT41(local_a8._M_allocated_capacity._1_4_,
                                                 local_a8._M_local_buf[0]))) + 1);
    }
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
  }
  local_90 = (undefined1  [8])(CONCAT71(local_90._1_7_,local_53) ^ 1);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_53 == true) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_90,(AssertionResult *)"res.node.empty()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x726,(char *)_local_b8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b8 != &local_a8) {
      operator_delete(_local_b8,
                      CONCAT26(local_a8._M_allocated_capacity._6_2_,
                               CONCAT15(local_a8._M_local_buf[5],
                                        CONCAT41(local_a8._M_allocated_capacity._1_4_,
                                                 local_a8._M_local_buf[0]))) + 1);
    }
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
  }
  _local_b8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &DAT_400000003;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>>
  ::btree_set_container<int_const*>
            ((btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>>
              *)local_90,(int *)local_b8,(int *)&pbStack_b0,(key_compare *)local_c8,
             (allocator_type *)&local_d0);
  local_c8._0_4_ = 3;
  iVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          find<int>((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                     *)local_90,(int *)local_c8);
  position_00._8_8_ = iVar4._8_8_ & 0xffffffff;
  position_00.node = iVar4.node;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::extract((node_type *)local_b8,
            (btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
             *)local_90,position_00);
  _Var2._M_p = (pointer)_local_b8;
  if (local_70.
      super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
      .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
      super__Optional_payload<std::allocator<int>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<int>_>._M_engaged == true) {
    local_70.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = false;
  }
  if (local_b8[1] == true) {
    local_70.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .alloc_.super__Optional_base<std::allocator<int>,_false,_false>._M_payload.
    super__Optional_payload<std::allocator<int>,_true,_false,_false>.
    super__Optional_payload_base<std::allocator<int>_>._M_engaged = true;
    local_70.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .slot_space_.data[0] = aStack_b4.data[0];
    local_70.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .slot_space_.data[1] = aStack_b4.data[1];
    local_70.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .slot_space_.data[2] = aStack_b4.data[2];
    local_70.
    super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
    .slot_space_.data[3] = aStack_b4.data[3];
  }
  local_c8._0_4_ = 4;
  _local_b8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var2._M_p;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_b8,local_c8,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"src2");
  if (local_b8[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::insert((insert_return_type *)local_b8,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
            *)&local_40,&local_70);
  local_58[0] = (internal)local_a8._M_local_buf[0];
  local_68 = (undefined1  [8])_local_b8;
  pbStack_60 = pbStack_b0;
  if (local_53 == true) {
    local_53 = false;
  }
  if (local_a8._M_local_buf[5] == '\x01') {
    local_53 = true;
    local_50[0].data[0] = local_a8._M_local_buf[8];
    local_50[0].data[1] = local_a8._M_local_buf[9];
    local_50[0].data[2] = local_a8._M_local_buf[10];
    local_50[0].data[3] = local_a8._M_local_buf[0xb];
  }
  local_c8._0_4_ = 3;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_b8,local_c8,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"other");
  if (local_b8[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_d0.data_._0_4_ = 3;
  iVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          find<int>(&local_40,(int *)&local_d0);
  local_c8 = (undefined1  [8])iVar4.node;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_c0._4_4_,iVar4.position);
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>>
            ((internal *)local_b8,"res.position","other.find(3)",
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)local_68,
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)local_c8);
  if (local_b8[0] == (key_compare)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_b0,pbStack_b0);
  }
  local_c8 = (undefined1  [8])(CONCAT71(local_c8._1_7_,local_58[0]) ^ 1);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58[0] != (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_c8,(AssertionResult *)"res.inserted","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72e,(char *)_local_b8);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b8 != &local_a8) {
      operator_delete(_local_b8,
                      CONCAT26(local_a8._M_allocated_capacity._6_2_,
                               CONCAT15(local_a8._M_local_buf[5],
                                        CONCAT41(local_a8._M_allocated_capacity._1_4_,
                                                 local_a8._M_local_buf[0]))) + 1);
    }
    if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
  }
  auVar1 = local_c8;
  local_c8[0] = local_53;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_53 == false) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_c0;
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_c8,(AssertionResult *)"res.node.empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72f,(char *)_local_b8);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_b8 != &local_a8) {
      operator_delete(_local_b8,
                      CONCAT26(local_a8._M_allocated_capacity._6_2_,
                               CONCAT15(local_a8._M_local_buf[5],
                                        CONCAT41(local_a8._M_allocated_capacity._1_4_,
                                                 local_a8._M_local_buf[0]))) + 1);
    }
    if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
    }
    __ptr_00 = local_c0;
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001bdf49;
  }
  else {
    local_c8._4_4_ = auVar1._4_4_;
    local_c8._0_4_ = 3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_b8,"res.node.value()","3",(int *)local_50,(int *)local_c8);
    if (local_b8[0] == (key_compare)0x0) {
      testing::Message::Message((Message *)local_c8);
      if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (pbStack_b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x730,message);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    if (pbStack_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001bdf49;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_b0;
    __ptr_00 = pbStack_b0;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_001bdf49:
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::~btree
            ((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              *)local_90);
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::~btree
            (&local_40);
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::~btree
            (&local_28);
  return;
}

Assistant:

TEST(Btree, ExtractAndInsertNodeHandleSet) {
        phmap::btree_set<int> src1 = {1, 2, 3, 4, 5};
        auto nh = src1.extract(src1.find(3));
        EXPECT_THAT(src1, ElementsAre(1, 2, 4, 5));
        phmap::btree_set<int> other;
        phmap::btree_set<int>::insert_return_type res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3));
        EXPECT_EQ(res.position, other.find(3));
        EXPECT_TRUE(res.inserted);
        EXPECT_TRUE(res.node.empty());

        phmap::btree_set<int> src2 = {3, 4};
        nh = src2.extract(src2.find(3));
        EXPECT_THAT(src2, ElementsAre(4));
        res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3));
        EXPECT_EQ(res.position, other.find(3));
        EXPECT_FALSE(res.inserted);
        ASSERT_FALSE(res.node.empty());
        EXPECT_EQ(res.node.value(), 3);
    }